

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::RetentionStripTest_StripSourceRetentionOneofOptions_Test
::TestBody(RetentionStripTest_StripSourceRetentionOneofOptions_Test *this)

{
  bool bVar1;
  FileDescriptor *this_00;
  Descriptor *pDVar2;
  Message *this_01;
  MessageLite *this_02;
  OneofDescriptor *oneof;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar3;
  Message *output;
  EqualsProtoMatcherP<google::protobuf::OneofOptions> *matcher;
  EqualsProtoMatcherP<google::protobuf::OneofOptions> *matcher_00;
  EqualsProtoMatcherP<google::protobuf::OneofOptions> *matcher_01;
  EqualsProtoMatcherP<google::protobuf::OneofOptions> *matcher_02;
  char *pcVar4;
  string_view input;
  string_view data;
  string_view name;
  string_view name_00;
  string_view sVar5;
  string_view file_name;
  AssertionResult gtest_ar;
  OneofOptions local_438;
  DynamicMessageFactory factory;
  RepeatedPtrFieldBase local_358 [4];
  OneofOptions expected_options;
  OneofOptions local_2a0;
  OneofOptions local_250;
  OneofOptions local_200;
  OneofOptions local_1b0;
  OneofOptions local_160;
  OneofOptions local_110;
  OneofOptions local_c0;
  OneofOptions local_70;
  
  output = (Message *)&DAT_00000009;
  sVar5._M_str = 
  "\n      message TestMessage {\n        oneof test_oneof {\n        option (source_retention_option) = 123;\n        option (options) = {\n          i1: 123\n          i2: 456\n          c { s: \"abc\" }\n          rc { s: \"abc\" }\n        };\n        option (repeated_options) = {\n          i1: 111 i2: 222\n        };\n          string field1 = 1;\n          string field2 = 2;\n        };\n      }\n\n      message Options {\n        optional int32 i1 = 1 [retention = RETENTION_SOURCE];\n        optional int32 i2 = 2;\n        message ChildMessage {\n          optional string s = 1 [retention = RETENTION_SOURCE];\n        }\n        optional ChildMessage c = 3;\n        repeated ChildMessage rc = 4;\n      }\n\n      extend google.protobuf.OneofOptions {\n        optional int32 source_retention_option = 50000 [retention = RETENTION_SOURCE];\n        optional Options options = 50001;\n        repeated Options repeated_options = 50002;\n      }"
  ;
  sVar5._M_len = 0x399;
  file_name._M_str = "foo.proto";
  file_name._M_len = 9;
  this_00 = RetentionStripTest::ParseSchema(&this->super_RetentionStripTest,sVar5,file_name);
  OneofOptions::OneofOptions((OneofOptions *)&factory);
  sVar5 = MessageLite::GetTypeName((MessageLite *)&factory);
  pDVar2 = DescriptorPool::FindMessageTypeByName(&(this->super_RetentionStripTest).pool_,sVar5);
  OneofOptions::~OneofOptions((OneofOptions *)&factory);
  DynamicMessageFactory::DynamicMessageFactory(&factory);
  this_01 = DynamicMessageFactory::GetPrototype(&factory,pDVar2);
  this_02 = &Message::New(this_01)->super_MessageLite;
  input._M_str = (char *)this_02;
  input._M_len = (size_t)
                 "\n        [google.protobuf.internal.options] {\n          i2: 456\n          c {}\n          rc {}\n        }\n        [google.protobuf.internal.repeated_options] { i2: 222 }"
  ;
  bVar1 = TextFormat::ParseFromString((TextFormat *)0xa8,input,output);
  if (!bVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_438,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
               ,0x5f,"TextFormat::ParseFromString(data, dynamic_message.get())");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_438);
  }
  OneofOptions::OneofOptions(&expected_options);
  MessageLite::SerializeAsString_abi_cxx11_((string *)&local_438,this_02);
  data._M_str = (char *)local_438.super_Message.super_MessageLite._vptr_MessageLite;
  data._M_len = local_438.super_Message.super_MessageLite._internal_metadata_.ptr_;
  bVar1 = MessageLite::ParseFromString((MessageLite *)&expected_options,data);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_438);
    (*this_02->_vptr_MessageLite[1])(this_02);
    DynamicMessageFactory::~DynamicMessageFactory(&factory);
    name._M_str = "TestMessage";
    name._M_len = 0xb;
    factory.super_MessageFactory._vptr_MessageFactory =
         (_func_int **)FileDescriptor::FindMessageTypeByName(this_00,name);
    pDVar2 = absl::lts_20250127::log_internal::DieIfNull<google::protobuf::Descriptor_const*>
                       ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
                        ,0x1f8,"file->FindMessageTypeByName(\"TestMessage\")",
                        (Descriptor **)&factory);
    name_00._M_str = "test_oneof";
    name_00._M_len = 10;
    factory.super_MessageFactory._vptr_MessageFactory =
         (_func_int **)Descriptor::FindOneofByName(pDVar2,name_00);
    oneof = absl::lts_20250127::log_internal::DieIfNull<google::protobuf::OneofDescriptor_const*>
                      ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
                       ,0x1fa,"message->FindOneofByName(\"test_oneof\")",
                       (OneofDescriptor **)&factory);
    OneofOptions::OneofOptions(&local_1b0,&expected_options);
    EqualsProto<google::protobuf::OneofOptions>
              ((EqualsProtoMatcherP<google::protobuf::OneofOptions> *)&local_70,&local_1b0);
    testing::internal::
    MakePredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>>
              ((PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>_>
                *)&local_438,(internal *)&local_70,matcher);
    StripSourceRetentionOptions((FileDescriptorProto *)&factory,this_00,false);
    pVVar3 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                       ((RepeatedPtrFieldBase *)
                        ((long)&factory.prototypes_.
                                super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
                                .
                                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
                                .settings_.
                                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                .
                                super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                .value.heap_or_soo_ + 8),0);
    protobuf::internal::RepeatedPtrFieldBase::
    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
              (&(pVVar3->field_0)._impl_.oneof_decl_.super_RepeatedPtrFieldBase,0);
    testing::internal::
    PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>>
    ::operator()(&gtest_ar,(char *)&local_438,
                 (OneofOptions *)
                 "StripSourceRetentionOptions(*file) .message_type(0) .oneof_decl(0) .options()");
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&factory);
    OneofOptions::~OneofOptions(&local_438);
    OneofOptions::~OneofOptions(&local_70);
    OneofOptions::~OneofOptions(&local_1b0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&factory);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar4 = anon_var_dwarf_651463 + 5;
      }
      else {
        pcVar4 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_438,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
                 ,0x200,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_438,(Message *)&factory);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_438);
      if (factory.super_MessageFactory._vptr_MessageFactory != (_func_int **)0x0) {
        (**(code **)(*factory.super_MessageFactory._vptr_MessageFactory + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    OneofOptions::OneofOptions(&local_200,&expected_options);
    EqualsProto<google::protobuf::OneofOptions>
              ((EqualsProtoMatcherP<google::protobuf::OneofOptions> *)&local_c0,&local_200);
    testing::internal::
    MakePredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>>
              ((PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>_>
                *)&local_438,(internal *)&local_c0,matcher_00);
    StripSourceRetentionOptions((DescriptorProto *)&factory,pDVar2);
    protobuf::internal::RepeatedPtrFieldBase::
    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
              (local_358,0);
    testing::internal::
    PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>>
    ::operator()(&gtest_ar,(char *)&local_438,
                 (OneofOptions *)"StripSourceRetentionOptions(*message).oneof_decl(0).options()");
    DescriptorProto::~DescriptorProto((DescriptorProto *)&factory);
    OneofOptions::~OneofOptions(&local_438);
    OneofOptions::~OneofOptions(&local_c0);
    OneofOptions::~OneofOptions(&local_200);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&factory);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar4 = anon_var_dwarf_651463 + 5;
      }
      else {
        pcVar4 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_438,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
                 ,0x202,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_438,(Message *)&factory);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_438);
      if (factory.super_MessageFactory._vptr_MessageFactory != (_func_int **)0x0) {
        (**(code **)(*factory.super_MessageFactory._vptr_MessageFactory + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    OneofOptions::OneofOptions(&local_250,&expected_options);
    EqualsProto<google::protobuf::OneofOptions>
              ((EqualsProtoMatcherP<google::protobuf::OneofOptions> *)&local_110,&local_250);
    testing::internal::
    MakePredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>>
              ((PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>_>
                *)&factory,(internal *)&local_110,matcher_01);
    StripSourceRetentionOptions((OneofDescriptorProto *)&local_438,oneof);
    testing::internal::
    PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>>
    ::operator()(&gtest_ar,(char *)&factory,
                 (OneofOptions *)"StripSourceRetentionOptions(*oneof).options()");
    OneofDescriptorProto::~OneofDescriptorProto((OneofDescriptorProto *)&local_438);
    OneofOptions::~OneofOptions((OneofOptions *)&factory);
    OneofOptions::~OneofOptions(&local_110);
    OneofOptions::~OneofOptions(&local_250);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&factory);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar4 = anon_var_dwarf_651463 + 5;
      }
      else {
        pcVar4 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_438,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
                 ,0x204,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_438,(Message *)&factory);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_438);
      if (factory.super_MessageFactory._vptr_MessageFactory != (_func_int **)0x0) {
        (**(code **)(*factory.super_MessageFactory._vptr_MessageFactory + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    OneofOptions::OneofOptions(&local_2a0,&expected_options);
    EqualsProto<google::protobuf::OneofOptions>
              ((EqualsProtoMatcherP<google::protobuf::OneofOptions> *)&local_160,&local_2a0);
    testing::internal::
    MakePredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>>
              ((PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>_>
                *)&factory,(internal *)&local_160,matcher_02);
    StripLocalSourceRetentionOptions(&local_438,oneof);
    testing::internal::
    PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>>
    ::operator()(&gtest_ar,(char *)&factory,
                 (OneofOptions *)"StripLocalSourceRetentionOptions(*oneof)");
    OneofOptions::~OneofOptions(&local_438);
    OneofOptions::~OneofOptions((OneofOptions *)&factory);
    OneofOptions::~OneofOptions(&local_160);
    OneofOptions::~OneofOptions(&local_2a0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&factory);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar4 = anon_var_dwarf_651463 + 5;
      }
      else {
        pcVar4 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_438,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
                 ,0x206,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_438,(Message *)&factory);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_438);
      if (factory.super_MessageFactory._vptr_MessageFactory != (_func_int **)0x0) {
        (**(code **)(*factory.super_MessageFactory._vptr_MessageFactory + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    OneofOptions::~OneofOptions(&expected_options);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&gtest_ar,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
             ,0x61,"ret.ParseFromString(dynamic_message->SerializeAsString())");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&gtest_ar);
}

Assistant:

TEST_F(RetentionStripTest, StripSourceRetentionOneofOptions) {
  const FileDescriptor* file = ParseSchema(R"schema(
      message TestMessage {
        oneof test_oneof {
        option (source_retention_option) = 123;
        option (options) = {
          i1: 123
          i2: 456
          c { s: "abc" }
          rc { s: "abc" }
        };
        option (repeated_options) = {
          i1: 111 i2: 222
        };
          string field1 = 1;
          string field2 = 2;
        };
      }

      message Options {
        optional int32 i1 = 1 [retention = RETENTION_SOURCE];
        optional int32 i2 = 2;
        message ChildMessage {
          optional string s = 1 [retention = RETENTION_SOURCE];
        }
        optional ChildMessage c = 3;
        repeated ChildMessage rc = 4;
      }

      extend google.protobuf.OneofOptions {
        optional int32 source_retention_option = 50000 [retention = RETENTION_SOURCE];
        optional Options options = 50001;
        repeated Options repeated_options = 50002;
      })schema");

  OneofOptions expected_options = BuildDynamicProto<OneofOptions>(
      R"pb(
        [google.protobuf.internal.options] {
          i2: 456
          c {}
          rc {}
        }
        [google.protobuf.internal.repeated_options] { i2: 222 })pb");
  const Descriptor* message =
      ABSL_DIE_IF_NULL(file->FindMessageTypeByName("TestMessage"));
  const OneofDescriptor* oneof =
      ABSL_DIE_IF_NULL(message->FindOneofByName("test_oneof"));

  EXPECT_THAT(StripSourceRetentionOptions(*file)
                  .message_type(0)
                  .oneof_decl(0)
                  .options(),
              EqualsProto(expected_options));
  EXPECT_THAT(StripSourceRetentionOptions(*message).oneof_decl(0).options(),
              EqualsProto(expected_options));
  EXPECT_THAT(StripSourceRetentionOptions(*oneof).options(),
              EqualsProto(expected_options));
  EXPECT_THAT(StripLocalSourceRetentionOptions(*oneof),
              EqualsProto(expected_options));
}